

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void getPLU(double *A,int M,int N,int *ipiv,double *P,double *L,double *U)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  int iVar10;
  
  uVar7 = (ulong)(uint)N;
  if ((M != 0 && P != (double *)0x0) &&
     (memset(P,0,(ulong)(M * M + (uint)(M * M == 0)) << 3), 0 < M)) {
    uVar6 = 0;
    do {
      P[(long)ipiv[uVar6] * (long)M + uVar6] = 1.0;
      uVar6 = uVar6 + 1;
    } while ((uint)M != uVar6);
  }
  iVar4 = M - N;
  if (iVar4 == 0) {
    if (0 < M && L != (double *)0x0) {
      uVar7 = (ulong)(uint)M;
      uVar6 = 0;
      pdVar8 = A;
      pdVar9 = L;
      do {
        if (uVar6 != 0) {
          uVar1 = 0;
          do {
            pdVar9[uVar1] = pdVar8[uVar1];
            uVar1 = uVar1 + 1;
          } while (uVar6 != uVar1);
        }
        iVar4 = (int)uVar6;
        L[uVar6 + (uint)(iVar4 * M)] = 1.0;
        uVar6 = uVar6 + 1;
        if (uVar6 < uVar7) {
          memset(L + ((M + 1) * iVar4 + 1),0,(ulong)(uint)((M + -2) - iVar4) * 8 + 8);
        }
        pdVar9 = pdVar9 + uVar7;
        pdVar8 = pdVar8 + uVar7;
      } while (uVar6 != uVar7);
    }
    if (U != (double *)0x0 && 0 < M) {
      uVar7 = (ulong)(uint)M;
      uVar1 = 0;
      pdVar8 = U;
      uVar6 = uVar7;
      do {
        if (uVar1 != 0) {
          memset(U + (uint)((int)uVar1 * M),0,uVar1 * 8);
        }
        uVar2 = 0;
        do {
          pdVar8[uVar2] = A[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
        uVar1 = uVar1 + 1;
        pdVar8 = pdVar8 + uVar7 + 1;
        A = A + uVar7 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (iVar4 == 0 || M < N) {
    if (M < N) {
      lVar3 = (long)N;
      if (0 < M && L != (double *)0x0) {
        uVar6 = (ulong)(uint)M;
        uVar1 = 0;
        pdVar8 = A;
        pdVar9 = L;
        do {
          if (uVar1 != 0) {
            uVar2 = 0;
            do {
              pdVar9[uVar2] = pdVar8[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar1 != uVar2);
          }
          iVar4 = (int)uVar1;
          uVar5 = (M + 1) * iVar4;
          L[uVar5] = 1.0;
          uVar1 = uVar1 + 1;
          if (uVar1 < uVar6) {
            memset(L + (uVar5 + 1),0,(ulong)(uint)((M + -2) - iVar4) * 8 + 8);
          }
          pdVar9 = pdVar9 + uVar6;
          pdVar8 = pdVar8 + lVar3;
        } while (uVar1 != uVar6);
      }
      if (U != (double *)0x0 && 0 < M) {
        uVar6 = 0;
        pdVar8 = U;
        do {
          if (uVar6 != 0) {
            memset(U + (int)uVar6 * N,0,uVar6 * 8);
          }
          if ((long)uVar6 < lVar3) {
            uVar1 = 0;
            do {
              pdVar8[uVar1] = A[uVar1];
              uVar1 = uVar1 + 1;
            } while (uVar7 != uVar1);
          }
          uVar6 = uVar6 + 1;
          A = A + lVar3 + 1;
          pdVar8 = pdVar8 + lVar3 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar6 != (uint)M);
      }
    }
  }
  else {
    if (L != (double *)0x0) {
      if (N < 1) {
        uVar6 = (long)N;
      }
      else {
        uVar1 = 0;
        pdVar8 = A;
        pdVar9 = L;
        do {
          if (uVar1 != 0) {
            uVar6 = 0;
            do {
              pdVar9[uVar6] = pdVar8[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
          iVar10 = (int)uVar1;
          L[uVar1 + (uint)(iVar10 * N)] = 1.0;
          uVar1 = uVar1 + 1;
          if (uVar1 < uVar7) {
            memset(L + ((N + 1) * iVar10 + 1),0,(ulong)(uint)((N + -2) - iVar10) * 8 + 8);
          }
          pdVar9 = pdVar9 + uVar7;
          pdVar8 = pdVar8 + uVar7;
          uVar6 = uVar7;
        } while (uVar1 != uVar7);
      }
      memcpy(L + (uint)(N * N),A + (uint)(N * N),(long)iVar4 * uVar6 * 8);
    }
    if (0 < N && U != (double *)0x0) {
      uVar1 = 0;
      pdVar8 = U;
      uVar6 = uVar7;
      do {
        if (uVar1 != 0) {
          memset(U + (uint)((int)uVar1 * N),0,uVar1 * 8);
        }
        uVar2 = 0;
        do {
          pdVar8[uVar2] = A[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
        uVar1 = uVar1 + 1;
        pdVar8 = pdVar8 + uVar7 + 1;
        A = A + uVar7 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar1 != uVar7);
    }
  }
  return;
}

Assistant:

void getPLU(double *A, int M , int N, int *ipiv,double *P, double *L, double *U) {
	int i, j,k;
	// Initialize all the arrays
	// P - M*M 
	// M > N
	// L - M*N , U - N*N
	// M = N
	// L - M*M , U M*M
	// M < N
	// L - M*M, U - M*N

	if (P) {
		for (i = 0; i < M*M; ++i) {
			P[i] = 0.0;
		}
		for (j = 0; j < M; ++j) {
			P[ipiv[j]*M + j] = 1.0;
		}
	}

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
}